

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::OpenCompactionOutputFile(DBImpl *this,CompactionState *compact)

{
  int iVar1;
  TableBuilder *this_00;
  long in_RDX;
  uint64_t file_number;
  string fname;
  _func_int **local_88;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (in_RDX == 0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x31c,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
  }
  if (*(long *)(in_RDX + 0x30) == 0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&compact[3].smallest_snapshot);
    if (iVar1 == 0) {
      local_88 = compact[8].outfile[9]._vptr_WritableFile;
      compact[8].outfile[9]._vptr_WritableFile = (_func_int **)((long)local_88 + 1);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&compact[7].outfile,(unsigned_long *)&local_88);
      local_80._16_8_ = &local_60;
      local_80._0_8_ = local_88;
      local_80._24_8_ = 0;
      local_60._M_local_buf[0] = '\0';
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_50._M_p = (pointer)&local_40;
      std::
      vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ::push_back((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                   *)(in_RDX + 0x10),(value_type *)local_80);
      pthread_mutex_unlock((pthread_mutex_t *)&compact[3].smallest_snapshot);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._16_8_ != &local_60) {
        operator_delete((void *)local_80._16_8_);
      }
      TableFileName((string *)local_80,
                    (string *)
                    &compact[2].outputs.
                     super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(uint64_t)local_88);
      (**(code **)(*(long *)compact->smallest_snapshot + 0x20))
                (this,(long *)compact->smallest_snapshot,(string *)local_80,in_RDX + 0x28);
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        this_00 = (TableBuilder *)operator_new(8);
        TableBuilder::TableBuilder
                  (this_00,(Options *)&compact->builder,*(WritableFile **)(in_RDX + 0x28));
        *(TableBuilder **)(in_RDX + 0x30) = this_00;
      }
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_);
      }
      return (Status)(char *)this;
    }
    std::__throw_system_error(iVar1);
  }
  __assert_fail("compact->builder == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                ,0x31d,"Status leveldb::DBImpl::OpenCompactionOutputFile(CompactionState *)");
}

Assistant:

Status DBImpl::OpenCompactionOutputFile(CompactionState* compact) {
  assert(compact != nullptr);
  assert(compact->builder == nullptr);
  uint64_t file_number;
  {
    mutex_.Lock();
    file_number = versions_->NewFileNumber();
    pending_outputs_.insert(file_number);
    CompactionState::Output out;
    out.number = file_number;
    out.smallest.Clear();
    out.largest.Clear();
    compact->outputs.push_back(out);
    mutex_.Unlock();
  }

  // Make the output file
  std::string fname = TableFileName(dbname_, file_number);
  Status s = env_->NewWritableFile(fname, &compact->outfile);
  if (s.ok()) {
    compact->builder = new TableBuilder(options_, compact->outfile);
  }
  return s;
}